

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

bool __thiscall wallet::CWallet::DelAddressBook(CWallet *this,CTxDestination *address)

{
  WalletDatabase *database;
  bool bVar1;
  long in_FS_OFFSET;
  string_view process_desc;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  database = (this->m_database)._M_t.
             super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
             .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
  if (database == (WalletDatabase *)0x0) {
    __assert_fail("static_cast<bool>(m_database)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                  ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
  }
  pcStack_20 = std::
               _Function_handler<bool_(wallet::WalletBatch_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:2473:87)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(wallet::WalletBatch_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:2473:87)>
             ::_M_manager;
  process_desc._M_str = "address book entry removal";
  process_desc._M_len = 0x1a;
  local_38._M_unused._M_object = this;
  local_38._8_8_ = address;
  bVar1 = RunWithinTxn(database,process_desc,(function<bool_(wallet::WalletBatch_&)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::DelAddressBook(const CTxDestination& address)
{
    return RunWithinTxn(GetDatabase(), /*process_desc=*/"address book entry removal", [&](WalletBatch& batch){
        return DelAddressBookWithDB(batch, address);
    });
}